

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O0

ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
* getFileAux<llvm::WritableMemoryBuffer>
            (ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
             *__return_storage_ptr__,Twine *Filename,int64_t FileSize,uint64_t MapSize,
            uint64_t Offset,bool RequiresNullTerminator,bool IsVolatile)

{
  bool bVar1;
  error_code eVar2;
  undefined1 local_48 [8];
  error_code EC;
  int FD;
  bool IsVolatile_local;
  bool RequiresNullTerminator_local;
  uint64_t Offset_local;
  uint64_t MapSize_local;
  int64_t FileSize_local;
  Twine *Filename_local;
  ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
  *Ret;
  
  EC._M_cat._6_1_ = IsVolatile;
  EC._M_cat._7_1_ = RequiresNullTerminator;
  eVar2 = llvm::sys::fs::openFileForRead
                    (Filename,(int *)&EC._M_cat,F_None,(SmallVectorImpl<char> *)0x0);
  EC._0_8_ = eVar2._M_cat;
  local_48._0_4_ = eVar2._M_value;
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_48);
  if (bVar1) {
    eVar2._4_4_ = 0;
    eVar2._M_value = local_48._0_4_;
    eVar2._M_cat = (error_category *)EC._0_8_;
    llvm::
    ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
    ::ErrorOr(__return_storage_ptr__,eVar2);
  }
  else {
    getOpenFileImpl<llvm::WritableMemoryBuffer>
              (__return_storage_ptr__,(int)EC._M_cat,Filename,FileSize,MapSize,Offset,
               (bool)(EC._M_cat._7_1_ & 1),(bool)(EC._M_cat._6_1_ & 1));
    close((int)EC._M_cat);
  }
  return __return_storage_ptr__;
}

Assistant:

static ErrorOr<std::unique_ptr<MB>>
getFileAux(const Twine &Filename, int64_t FileSize, uint64_t MapSize,
           uint64_t Offset, bool RequiresNullTerminator, bool IsVolatile) {
  int FD;
  std::error_code EC = sys::fs::openFileForRead(Filename, FD, sys::fs::OF_None);

  if (EC)
    return EC;

  auto Ret = getOpenFileImpl<MB>(FD, Filename, FileSize, MapSize, Offset,
                                 RequiresNullTerminator, IsVolatile);
  close(FD);
  return Ret;
}